

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

void __thiscall MyCompiler::RecursiveDescentParser::finish(RecursiveDescentParser *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"eof expected",&local_31);
  except(this,NUL,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MyCompiler::RecursiveDescentParser::finish()
{
    except(SymbolType::NUL, "eof expected");
}